

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::ReportCounts
          (BasicReporter *this,string *label,Counts *counts,string *allPrefix)

{
  ostream *poVar1;
  size_t sVar2;
  pluralise local_88;
  byte local_4a;
  allocator<char> local_49;
  string local_48 [32];
  string *local_28;
  string *allPrefix_local;
  Counts *counts_local;
  string *label_local;
  BasicReporter *this_local;
  
  local_28 = allPrefix;
  allPrefix_local = (string *)counts;
  counts_local = (Counts *)label;
  label_local = (string *)this;
  if (counts->passed == 0) {
    poVar1 = (this->m_config).stream;
    local_4a = 0;
    if (counts->failed < 2) {
      std::allocator<char>::allocator();
      local_4a = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
    }
    else {
      std::__cxx11::string::string(local_48,(string *)allPrefix);
    }
    poVar1 = std::operator<<(poVar1,local_48);
    pluralise::pluralise(&local_88,allPrefix_local->_M_string_length,(string *)counts_local);
    poVar1 = Catch::operator<<(poVar1,&local_88);
    std::operator<<(poVar1," failed");
    pluralise::~pluralise(&local_88);
    std::__cxx11::string::~string(local_48);
    if ((local_4a & 1) != 0) {
      std::allocator<char>::~allocator(&local_49);
    }
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<((this->m_config).stream,counts->failed);
    poVar1 = std::operator<<(poVar1," of ");
    sVar2 = Counts::total((Counts *)allPrefix_local);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)counts_local);
    std::operator<<(poVar1,"s failed");
  }
  return;
}

Assistant:

void ReportCounts( const std::string& label, const Counts& counts, const std::string& allPrefix = "All " ) {
            if( counts.passed )
                m_config.stream << counts.failed << " of " << counts.total() << " " << label << "s failed";
            else
                m_config.stream << ( counts.failed > 1 ? allPrefix : "" ) << pluralise( counts.failed, label ) << " failed";
        }